

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Maybe<capnp::EnumSchema::Enumerant> * __thiscall
capnp::DynamicEnum::getEnumerant
          (Maybe<capnp::EnumSchema::Enumerant> *__return_storage_ptr__,DynamicEnum *this)

{
  ushort uVar1;
  NullableValue<capnp::EnumSchema::Enumerant> *pNVar2;
  EnumerantList enumerants;
  EnumerantList local_98;
  undefined4 local_56;
  undefined2 local_52;
  StructReader local_50;
  
  EnumSchema::getEnumerants(&local_98,&this->schema);
  uVar1 = this->value;
  if (uVar1 < local_98.list.reader.elementCount) {
    capnp::_::ListReader::getStructElement(&local_50,&local_98.list.reader,(uint)uVar1);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
         (RawBrandedSchema *)local_98.parent.super_Schema.raw;
    (__return_storage_ptr__->ptr).field_1.value.ordinal = uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 10) = local_56;
    *(undefined2 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xe) = local_52;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = local_50.segment;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable = local_50.capTable;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_50.data;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = local_50.pointers;
    pNVar2 = &__return_storage_ptr__->ptr;
    *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x30) = local_50.dataSize;
    *(StructPointerCount *)((long)&pNVar2->field_1 + 0x34) = local_50.pointerCount;
    *(undefined2 *)((long)&pNVar2->field_1 + 0x36) = local_50._38_2_;
    *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_50.nestingLimit;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x3c) = local_50._44_4_;
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<EnumSchema::Enumerant> DynamicEnum::getEnumerant() const {
  auto enumerants = schema.getEnumerants();
  if (value < enumerants.size()) {
    return enumerants[value];
  } else {
    return kj::none;
  }
}